

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Expression __thiscall cnn::expr::kmh_ngram(expr *this,Expression *x,uint n)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  Node *pNVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  initializer_list<cnn::VariableIndex> __l;
  VariableIndex new_node_index;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  VariableIndex local_2c;
  
  this_00 = x->pg;
  local_2c.t = (x->i).t;
  local_3c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar2 = (Node *)operator_new(0x58);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_002a2658;
  __l._M_len = 1;
  __l._M_array = &local_2c;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (&pNVar2->args,__l,&local_3d);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_002a2fd8;
  *(uint *)&pNVar2[1]._vptr_Node = n;
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar2;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar2;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_3c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_3c.t;
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression kmh_ngram(const Expression& x, unsigned n) { return Expression(x.pg, x.pg->add_function<KMHNGram>({x.i}, n)); }